

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::DeepTiledOutputFile::Data::~Data(Data *this)

{
  BufferedTile *this_00;
  TileBuffer *pTVar1;
  long *plVar2;
  pointer pcVar3;
  _Rb_tree_node_base *p_Var4;
  pointer ppTVar5;
  pointer ppTVar6;
  _Link_type in_RSI;
  ulong uVar7;
  
  if (this->numXTiles != (int *)0x0) {
    operator_delete__(this->numXTiles);
  }
  if (this->numYTiles != (int *)0x0) {
    operator_delete__(this->numYTiles);
  }
  for (p_Var4 = (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->tileMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    this_00 = (BufferedTile *)p_Var4[1]._M_left;
    if (this_00 != (BufferedTile *)0x0) {
      anon_unknown_8::BufferedTile::~BufferedTile(this_00);
      in_RSI = (_Link_type)0x28;
      operator_delete(this_00,0x28);
    }
  }
  ppTVar5 = (this->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar5) {
    uVar7 = 0;
    do {
      pTVar1 = ppTVar5[uVar7];
      if (pTVar1 != (TileBuffer *)0x0) {
        if (*(long **)&pTVar1->dy != (long *)0x0) {
          (**(code **)(**(long **)&pTVar1->dy + 8))();
        }
        plVar2 = *(long **)((long)&(pTVar1->exception).field_2 + 8);
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 8))();
        }
        IlmThread_2_5::Semaphore::~Semaphore((Semaphore *)&pTVar1[1].dataSize);
        if (*(TileBuffer **)&pTVar1->field_0x70 != pTVar1 + 1) {
          operator_delete(*(TileBuffer **)&pTVar1->field_0x70,
                          (ulong)(pTVar1[1].uncompressedData + 1));
        }
        pcVar3 = (pTVar1->exception)._M_dataplus._M_p;
        if (pcVar3 != (pointer)0x0) {
          operator_delete__(pcVar3);
        }
        if (pTVar1->buffer != (char *)0x0) {
          operator_delete__(pTVar1->buffer);
        }
        in_RSI = (_Link_type)&DAT_000000b8;
        operator_delete(pTVar1,0xb8);
      }
      uVar7 = uVar7 + 1;
      ppTVar5 = (this->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->tileBuffers).
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >> 3))
    ;
  }
  ppTVar6 = (this->slices).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar6) {
    uVar7 = 0;
    do {
      if (ppTVar6[uVar7] != (TOutSliceInfo *)0x0) {
        in_RSI = (_Link_type)&DAT_00000038;
        operator_delete(ppTVar6[uVar7],0x38);
      }
      uVar7 = uVar7 + 1;
      ppTVar6 = (this->slices).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->slices).
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6 >> 3))
    ;
  }
  std::
  _Rb_tree<Imf_2_5::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
  ::_M_erase((_Rb_tree<Imf_2_5::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
              *)(this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,in_RSI);
  ppTVar5 = (this->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar5 != (pointer)0x0) {
    operator_delete(ppTVar5,(long)(this->tileBuffers).
                                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar5
                   );
  }
  ppTVar6 = (this->slices).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar6 != (pointer)0x0) {
    operator_delete(ppTVar6,(long)(this->slices).
                                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar6
                   );
  }
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&(this->tileOffsets)._offsets);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

DeepTiledOutputFile::Data::~Data ()
{
    delete [] numXTiles;
    delete [] numYTiles;

    //
    // Delete all the tile buffers, if any still happen to exist
    //

    for (TileMap::iterator i = tileMap.begin(); i != tileMap.end(); ++i)
        delete i->second;

    for (size_t i = 0; i < tileBuffers.size(); i++)
        if (tileBuffers[i] != 0)
            delete tileBuffers[i];

    for (size_t i = 0; i < slices.size(); i++)
        delete slices[i];
}